

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O0

ret_t trng::utility::
      u01xx_traits<double,_1UL,_std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>_>
      ::variate(discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                *r)

{
  ret_t rVar1;
  size_t i;
  ret_t ret;
  ret_t scale_per_step;
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
  *in_stack_ffffffffffffffe0;
  long lVar2;
  undefined8 local_18;
  
  local_18 = addin(in_stack_ffffffffffffffe0);
  for (lVar2 = 1; lVar2 == 0; lVar2 = lVar2 + 1) {
    rVar1 = addin((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                   *)0x0);
    local_18 = local_18 * 281474976710656.0 + rVar1;
  }
  return local_18;
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t variate(prng_t &r) {
        static_assert(prng_t::min() >= 0 and prng_t::max() > prng_t::min(),
                      "min max out of range");  // min and/or max out of spec?
        static_assert(prng_t::max() - prng_t::min() <= ~0ull,
                      "min max have exotic values/types");  // Bits, Holes incorrect otherwise
        static_assert(not math::numeric_limits<return_type>::is_integer, "not an integer");
        static_assert(calls_needed > 0 and calls_needed <= bits, "illegal number of calls");
        const ret_t scale_per_step(ret_t(domain_max) + 1);
        ret_t ret{addin(r)};
        for (std::size_t i{1}; i < calls_needed; ++i)
          ret = ret * scale_per_step + addin(r);
        return ret;
      }